

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O2

int Fra_SmlCheckOutput(Fra_Man_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  void *pvVar2;
  Aig_Obj_t *pObjPo;
  int i;
  
  i = 0;
  pvVar2 = Vec_PtrEntry(p->pManAig->vCos,0);
  if ((((uint)*(ulong *)((long)pvVar2 + 8) ^
       *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18) >> 3) & 1) != 0) {
    __assert_fail("Aig_ObjFanin0(pObj)->fPhase == (unsigned)Aig_ObjFaninC0(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                  ,0x14c,"int Fra_SmlCheckOutput(Fra_Man_t *)");
  }
  do {
    p_00 = p->pManAig->vCos;
    if (p_00->nSize <= i) {
      return 0;
    }
    pObjPo = (Aig_Obj_t *)Vec_PtrEntry(p_00,i);
    iVar1 = Fra_SmlNodeIsConst((Aig_Obj_t *)((ulong)pObjPo->pFanin0 & 0xfffffffffffffffe));
    i = i + 1;
  } while (iVar1 != 0);
  Fra_SmlCheckOutputSavePattern(p,pObjPo);
  return 1;
}

Assistant:

int Fra_SmlCheckOutput( Fra_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    // make sure the reference simulation pattern does not detect the bug
    pObj = Aig_ManCo( p->pManAig, 0 );
    assert( Aig_ObjFanin0(pObj)->fPhase == (unsigned)Aig_ObjFaninC0(pObj) ); 
    Aig_ManForEachCo( p->pManAig, pObj, i )
    {
        if ( !Fra_SmlNodeIsConst( Aig_ObjFanin0(pObj) ) )
        {
            // create the counter-example from this pattern
            Fra_SmlCheckOutputSavePattern( p, pObj );
            return 1;
        }
    }
    return 0;
}